

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

Status soplex::
       primalColStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 (int i,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *theLP)

{
  uint *puVar1;
  pointer pnVar2;
  pointer pnVar3;
  undefined8 uVar4;
  int iVar5;
  double *pdVar6;
  Status SVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *this;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  type t;
  cpp_dec_float<50U,_int,_void> local_78;
  double local_38;
  undefined8 uStack_30;
  
  pcVar8 = &local_78;
  this = &local_78;
  pcVar9 = &(theLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  ::soplex::infinity::__tls_init();
  pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_38 = *pdVar6;
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems._32_5_ = 0;
  local_78.data._M_elems[9]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  uStack_30 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_78,local_38);
  if (((pcVar9->fpclass == cpp_dec_float_NaN) || (local_78.fpclass == cpp_dec_float_NaN)) ||
     (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (pcVar9,&local_78), -1 < iVar5)) {
    pcVar8 = &(theLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    ::soplex::infinity::__tls_init();
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems._24_5_ = 0;
    local_78.data._M_elems[7]._1_3_ = 0;
    local_78.data._M_elems._32_5_ = 0;
    local_78.data._M_elems[9]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_78,-local_38);
    if ((pcVar8->fpclass == cpp_dec_float_NaN) || (local_78.fpclass == cpp_dec_float_NaN)) {
      return P_FREE;
    }
    iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (pcVar8,&local_78);
    SVar7 = -(uint)(iVar5 < 1);
  }
  else {
    pcVar9 = &(theLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    ::soplex::infinity::__tls_init();
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems._24_5_ = 0;
    local_78.data._M_elems[7]._1_3_ = 0;
    local_78.data._M_elems._32_5_ = 0;
    local_78.data._M_elems[9]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_78,-local_38);
    if ((pcVar9->fpclass == cpp_dec_float_NaN) || (local_78.fpclass == cpp_dec_float_NaN)) {
      return P_ON_UPPER;
    }
    iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (pcVar9,&local_78);
    if (iVar5 < 1) {
      return P_ON_UPPER;
    }
    pnVar2 = (theLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((pnVar2[i].m_backend.fpclass != cpp_dec_float_NaN) &&
        (pnVar3 = (theLP->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pnVar3[i].m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&pnVar2[i].m_backend,&pnVar3[i].m_backend), iVar5 == 0)) {
      return P_FIXED;
    }
    pnVar2 = (theLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pnVar2[i].m_backend.fpclass == cpp_dec_float_NaN) {
      return P_ON_UPPER;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_78,0,(type *)0x0);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&pnVar2[i].m_backend,&local_78);
    if (iVar5 == 0) {
      pnVar2 = (theLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20);
      local_78.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_78.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[i].m_backend.data;
      local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
      local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_78.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_78.exp = pnVar2[i].m_backend.exp;
      local_78.neg = pnVar2[i].m_backend.neg;
      local_78.fpclass = pnVar2[i].m_backend.fpclass;
      local_78.prec_elem = pnVar2[i].m_backend.prec_elem;
      if (local_78.data._M_elems[0] != 0 || local_78.fpclass != cpp_dec_float_finite) {
        local_78.neg = (bool)(local_78.neg ^ 1);
      }
      if (local_78.fpclass == cpp_dec_float_NaN) {
        return P_ON_UPPER;
      }
      pnVar2 = (theLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar2[i].m_backend.fpclass == cpp_dec_float_NaN) {
        return P_ON_UPPER;
      }
      pcVar8 = &pnVar2[i].m_backend;
    }
    else {
      pnVar2 = (theLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar2[i].m_backend.fpclass == cpp_dec_float_NaN) {
        return P_ON_UPPER;
      }
      this = &pnVar2[i].m_backend;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_78,0,(type *)0x0);
    }
    iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare(this,pcVar8);
    SVar7 = (uint)(-1 < iVar5) * 2;
  }
  return SVar7 | P_ON_LOWER;
}

Assistant:

static typename SPxBasisBase<R>::Desc::Status
primalColStatus(int i, const SPxLPBase<R>* theLP)
{
   assert(theLP != nullptr);

   if(theLP->upper(i) < R(infinity))
   {
      if(theLP->lower(i) > R(-infinity))
      {
         if(theLP->lower(i) == theLP->SPxLPBase<R>::upper(i))
            return SPxBasisBase<R>::Desc::P_FIXED;
         /*
           else
           return (-theLP->lower(i) < theLP->upper(i))
           ? SPxBasisBase<R>::Desc::P_ON_LOWER
           : SPxBasisBase<R>::Desc::P_ON_UPPER;
         */
         else if(theLP->maxObj(i) == 0)
            return (-theLP->lower(i) < theLP->upper(i))
                   ? SPxBasisBase<R>::Desc::P_ON_LOWER
                   : SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            return (theLP->maxObj(i) < 0)
                   ? SPxBasisBase<R>::Desc::P_ON_LOWER
                   : SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
      else
         return SPxBasisBase<R>::Desc::P_ON_UPPER;
   }
   else if(theLP->lower(i) > R(-infinity))
      return SPxBasisBase<R>::Desc::P_ON_LOWER;
   else
      return SPxBasisBase<R>::Desc::P_FREE;
}